

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slot.hpp
# Opt level: O3

Result_t __thiscall
sig::Slot<void(int),std::function<void(int)>>::operator()
          (Slot<void(int),std::function<void(int)>> *this,int *args)

{
  weak_ptr<void> *tracked;
  long lVar1;
  undefined8 uVar2;
  Locked_container_t l;
  int local_2c;
  Locked_container_t local_28;
  
  lVar1 = *(long *)(this + 8);
  while( true ) {
    if (lVar1 == *(long *)(this + 0x10)) {
      Slot_base::lock(&local_28,(Slot_base *)this);
      local_2c = *args;
      if (*(long *)(this + 0x30) != 0) {
        (**(code **)(this + 0x38))(this + 0x20,&local_2c);
        std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
                  (&local_28);
        return;
      }
      uVar2 = std::__throw_bad_function_call();
      std::vector<std::shared_ptr<void>,_std::allocator<std::shared_ptr<void>_>_>::~vector
                (&local_28);
      _Unwind_Resume(uVar2);
    }
    if (*(long *)(lVar1 + 8) == 0) {
      return;
    }
    if (*(int *)(*(long *)(lVar1 + 8) + 8) == 0) break;
    lVar1 = lVar1 + 0x10;
  }
  return;
}

Assistant:

Result_t operator()(Arguments&&... args) const {
        if (this->expired()) {
            return Result_t();
        }
        auto l = this->lock();
        return function_(std::forward<Arguments>(args)...);
    }